

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
SetPropertyFromDescriptor<true,int>
          (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *this,
          DynamicObject *instance,PropertyId propertyId,int propertyKey,
          SimpleDictionaryPropertyDescriptor<int> *descriptor,Var value,PropertyOperationFlags flags
          ,PropertyValueInfo *info)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *pSVar8;
  PropertyRecord **ppPVar9;
  PropertyRecord *pPVar10;
  UndeclaredBlockVariable *pUVar11;
  PropertyRecord *pPVar12;
  int local_60;
  uint local_5c;
  int propertyIndex;
  SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *local_50;
  SimpleDictionaryPropertyDescriptor<int> *local_48;
  ScriptContext *local_40;
  PropertyOperationFlags local_34;
  
  _propertyIndex = info;
  local_34 = flags;
  if (instance == (DynamicObject *)0x0) {
    local_40 = (ScriptContext *)CONCAT44(local_40._4_4_,propertyId);
    AssertCount = AssertCount + 1;
    local_50 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)instance;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x526,"(instance)","instance");
    if (!bVar4) goto LAB_00e3f80c;
    *puVar7 = 0;
    instance = (DynamicObject *)local_50;
    propertyId = (uint)local_40;
  }
  pTVar1 = ((Type *)&(((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                      instance)->super_DynamicTypeHandler).propertyTypes)->ptr;
  local_40 = (((pTVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  if ((descriptor->Attributes & 8) == 0) {
    if ((local_34 & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_None &&
        (descriptor->Attributes & 4) == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(local_34,local_40);
      if (_propertyIndex == (PropertyValueInfo *)0x0) {
        return 0;
      }
      _propertyIndex->m_instance = &instance->super_RecyclableObject;
      _propertyIndex->m_propertyIndex = 0xffff;
      _propertyIndex->m_attributes = '\0';
      _propertyIndex->flags = InlineCacheNoFlags;
      return 0;
    }
  }
  else {
    if (((byte)this[9] & 4) != 0) {
      pSVar8 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
               ConvertToNonSharedSimpleDictionaryType
                         ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                          this,instance);
      iVar5 = (*(pSVar8->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x17])
                        (pSVar8,instance,(ulong)(uint)propertyKey,value,(ulong)local_34,
                         _propertyIndex);
      return iVar5;
    }
    if (*(char *)&pTVar1[1].javascriptLibrary.ptr == '\x01') {
      if ((((byte)this[9] & 0x10) != 0) ||
         (*(char *)((long)&pTVar1[1].javascriptLibrary.ptr + 1) == '\x01')) {
        AssertCount = AssertCount + 1;
        local_50 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                   instance;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x547,
                                    "(!GetIsShared() && !instance->GetDynamicType()->GetIsShared())"
                                    ,"!GetIsShared() && !instance->GetDynamicType()->GetIsShared()")
        ;
        if (!bVar4) goto LAB_00e3f80c;
        *puVar7 = 0;
        instance = (DynamicObject *)local_50;
      }
      DynamicObject::ChangeType(instance);
    }
    local_5c = propertyKey;
    if (((local_34 & PropertyOperation_Force) == PropertyOperation_None) &&
       (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                          ((DynamicTypeHandler *)this,local_40,
                           (local_34 &
                           (PropertyOperation_ThrowIfNotExtensible|PropertyOperation_StrictMode)) !=
                           PropertyOperation_None), !bVar4)) {
      return 0;
    }
    propertyKey = local_5c;
    if ((((byte)this[0x28] & 2) != 0) &&
       (bVar4 = SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
                TryUndeleteProperty((SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>
                                     *)this,instance,descriptor->propertyIndex,&local_60),
       propertyKey = local_5c, bVar4)) {
      local_50 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)this;
      ppPVar9 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt(*(BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                             **)(this + 0x18),local_60);
      pPVar12 = *ppPVar9;
      pPVar10 = ScriptContext::GetPropertyName(local_40,propertyKey);
      if (pPVar12 != pPVar10) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x55e,
                                    "(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)))"
                                    ,
                                    "PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey))"
                                   );
        if (!bVar4) goto LAB_00e3f80c;
        *puVar7 = 0;
      }
      this = (SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)local_50;
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                                     *)*(anon_union_8_2_815e7e51_for_DynamicObject_2 *)
                                        &local_50->propertyMap,local_60);
    }
    bVar4 = SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>::
            SupportsSwitchingToUnordered
                      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                       this,local_40);
    if (bVar4) {
      ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)this)->
      numDeletedProperties =
           ((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)this)->
           numDeletedProperties + 0xff;
    }
    descriptor->Attributes = '\a';
    DynamicObject::SetHasNoEnumerableProperties(instance,false);
    if (propertyKey != 0xffffffff) {
      ScriptContext::InvalidateProtoCaches(local_40,propertyKey);
    }
    descriptor->Attributes = '\a';
    propertyId = propertyKey;
  }
  if (descriptor->propertyIndex != -1) {
    local_48 = descriptor;
    if ((((-1 < (char)local_34) && (0x3f < descriptor->Attributes)) &&
        (pUVar11 = (UndeclaredBlockVariable *)
                   DynamicObject::GetSlot(instance,descriptor->propertyIndex),
        (local_34 >> 8 & 1) == 0)) &&
       ((((local_40->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
        pUVar11)) {
      JavascriptError::ThrowReferenceError(local_40,-0x7ff5ec07,(PCWSTR)0x0);
    }
    pRVar2 = (((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)this)->
             singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pSVar8 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)0x0;
    }
    else {
      pSVar8 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
               (pRVar2->super_RecyclerWeakReferenceBase).strongRef;
    }
    if (pSVar8 != (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)instance
        && pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      AssertCount = AssertCount + 1;
      local_50 = (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)instance;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x588,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar4) goto LAB_00e3f80c;
      *puVar7 = 0;
      instance = (DynamicObject *)local_50;
    }
    if ((*(byte *)local_48 & 2) == 0) {
      if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (*(byte *)local_48 = *(byte *)local_48 | 2,
          pSVar8 == (SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)
                    instance)) &&
         ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < (uint)propertyKey)) {
        if (((((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true> *)this)->
             super_DynamicTypeHandler).flags & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x594,"(!GetIsShared())","!GetIsShared()");
          if (!bVar4) goto LAB_00e3f80c;
          *puVar7 = 0;
        }
        if (value == (Var)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x595,"(value != nullptr)","value != nullptr");
          if (!bVar4) goto LAB_00e3f80c;
          *puVar7 = 0;
        }
        BVar6 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar6 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                      ,0x597,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar4) {
LAB_00e3f80c:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
        bVar4 = VarIs<Js::JavascriptFunction>(value);
        if (bVar4) {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar4 = !bVar4;
        }
        else {
          bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            bVar4 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,propertyId,value);
          }
        }
        *(byte *)local_48 = *(byte *)local_48 & 0xfb | bVar4 << 2;
      }
    }
    else {
      pPVar12 = ScriptContext::GetPropertyName(local_40,propertyKey);
      InvalidateFixedField<Js::PropertyRecord_const*>
                (this,pPVar12,local_48,
                 (((((Type *)&(((SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>
                                 *)instance)->super_DynamicTypeHandler).propertyTypes)->ptr->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    DynamicTypeHandler::SetSlotUnchecked(instance,local_48->propertyIndex,value);
    if (_propertyIndex != (PropertyValueInfo *)0x0) {
      _propertyIndex->m_instance = &instance->super_RecyclableObject;
      _propertyIndex->m_propertyIndex = 0xffff;
      _propertyIndex->m_attributes = '\0';
      _propertyIndex->flags = InlineCacheNoFlags;
    }
  }
  TPropertyKey_GetUpdateSideEffectPropertyId<int>(propertyId,propertyKey);
  if (propertyKey != 0xffffffff) {
    DynamicTypeHandler::SetPropertyUpdateSideEffect
              ((DynamicTypeHandler *)this,instance,propertyKey,value,SideEffects_Any);
  }
  return 1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetPropertyFromDescriptor(DynamicObject* instance, PropertyId propertyId, TPropertyKey propertyKey, SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        Assert(instance);
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool throwIfNotExtensible = (flags & (PropertyOperation_ThrowIfNotExtensible | PropertyOperation_StrictMode)) != 0;

        if (!allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
        {
            // We have a shadowing case here.  An undeclared global property
            // is being added after a let/const was already declared.
            //
            // SimpleDictionaryTypeHandlerBase does not handle shadowed globals
            // because we do not want to add another property index field to the
            // property descriptors.  Instead convert to DictionaryTypeHandler
            // where it will reuse one of the getter/setter fields on its
            // property descriptor type.
            return
                ConvertToDictionaryType(instance)
                    ->SetProperty(
                            instance,
                            propertyId,
                            value,
                            flags,
                            info);
        }

        if (descriptor->Attributes & PropertyDeleted)
        {
            if(GetIsLocked())
            {
                return
                    ConvertToNonSharedSimpleDictionaryType(instance)->SetProperty(instance, propertyKey, value, flags, info);
            }
            else if (instance->GetDynamicType()->GetIsLocked())
            {
                Assert(!GetIsShared() && !instance->GetDynamicType()->GetIsShared());

                // We have changed the type of the only instance using this type handler, so we don't need to say the type handler is shared here.
                instance->ChangeType();
            }

            if (IsNotExtensibleSupported)
            {
                bool isForce = (flags & PropertyOperation_Force) != 0;
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }
            }

            if(isUnordered)
            {
                TPropertyIndex propertyIndex;
                if(AsUnordered()->TryUndeleteProperty(instance, descriptor->propertyIndex, &propertyIndex))
                {
                    Assert(PropertyRecordStringHashComparer<TMapKey>::Equals(propertyMap->GetKeyAt(propertyIndex), TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey)));
                    descriptor = propertyMap->GetReferenceAt(propertyIndex);
                }
            }

            if(SupportsSwitchingToUnordered(scriptContext))
            {
                --numDeletedProperties;
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
            instance->SetHasNoEnumerableProperties(false);
            propertyId = TPropertyKey_GetOptionalPropertyId(instance->GetScriptContext(), propertyKey);
            if (propertyId != Constants::NoProperty)
            {
                scriptContext->InvalidateProtoCaches(propertyId);
            }
            descriptor->Attributes = PropertyDynamicTypeDefaults;
        }
        else if (!(descriptor->Attributes & PropertyWritable) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(flags, scriptContext);

            // Since we separate LdFld and StFld caches there is no point in caching for StFld with non-writable properties, except perhaps
            // to prepopulate the type property cache (which we do share between LdFld and StFld), for potential future field loads. This
            // would require additional handling in CacheOperators::CachePropertyWrite, such that for !info-IsWritable() we don't populate
            // the local cache (that would be illegal), but still populate the type's property cache.
            PropertyValueInfo::SetNoCache(info, instance);
            return false;
        }

        if (descriptor->propertyIndex != NoSlots)
        {
            if ((descriptor->Attributes & PropertyNoRedecl) && !(flags & PropertyOperation_AllowUndecl))
            {
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(descriptor->propertyIndex)) && !(flags & PropertyOperation_AllowUndeclInConsoleScope))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }

#if ENABLE_FIXED_FIELDS
            DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
            Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
            if (!descriptor->isInitialized)
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    // Consider: It would be nice to assert the slot is actually null.  However, we sometimes pre-initialize to undefined or even
                    // some other special illegal value (for let or const), currently == null.
                    descriptor->isInitialized = true;
                    if (localSingletonInstance == instance &&
                        !TPropertyKey_IsInternalPropertyId(propertyKey) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(!GetIsShared());
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->isFixed = (VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(TMapKey_OptionalConvertPropertyIdToPropertyRecord(scriptContext, propertyKey), descriptor, instance->GetScriptContext());
            }
#endif

            SetSlotUnchecked(instance, descriptor->propertyIndex, value);

            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, descriptor->propertyIndex, descriptor->Attributes);
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }

        propertyId = TPropertyKey_GetUpdateSideEffectPropertyId(propertyId, propertyKey);
        if (propertyId != Constants::NoProperty)
        {
            SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
        }
        return true;
    }